

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::TriangleInterpolationTest::iterate
          (TriangleInterpolationTest *this)

{
  undefined8 *puVar1;
  size_type *psVar2;
  undefined8 uVar3;
  TestLog *log;
  bool bVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  char *description;
  IterateResult IVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int vtxNdx;
  ulong uVar13;
  float fVar14;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_268;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  ScopedLogSection section;
  RasterizationArguments local_1f8;
  string iterationDescription;
  undefined1 local_1b8 [8];
  pointer pSStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  float local_198 [6];
  float afStack_180 [2];
  float local_178 [2];
  float afStack_170 [2];
  float local_168 [2];
  float afStack_160 [2];
  bool local_158 [296];
  
  local_268._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                         this->m_iteration + 1);
  de::toString<int>((string *)&drawBuffer,(int *)&local_268);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",(string *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>((string *)&colorBuffer,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorBuffer);
  std::__cxx11::string::~string((string *)&colorBuffer);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,this->m_iteration + 1);
  de::toString<int>((string *)&resultImage,(int *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 "Iteration",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b8,&iterationDescription);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&resultImage);
  iVar5 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar5,iVar5);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8 = (undefined1  [8])0x3f800000;
  pSStack_1b0 = (pointer)0x3f80000000000000;
  local_1a8._M_allocated_capacity = 0x3f80000000000000;
  local_1a8._8_8_ = 0x3f80000000000000;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  local_198[2] = 1.0;
  local_198[3] = 1.0;
  deRandom_init((deRandom *)&local_1f8,
                this->m_iteration * 1000 + *(int *)&(this->super_BaseRenderingCase).field_0xc4 +
                0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&colorBuffer,6);
  lVar11 = 0;
  uVar13 = 0;
  while( true ) {
    if ((long)(int)((ulong)((long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar13)
    break;
    fVar14 = deRandom_getFloat((deRandom *)&local_1f8);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11) =
         fVar14 * 1.8 + -0.9;
    fVar14 = deRandom_getFloat((deRandom *)&local_1f8);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 4) =
         fVar14 * 1.8 + -0.9;
    *(undefined4 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 8) = 0;
    fVar14 = 1.0;
    if (this->m_projective == true) {
      fVar14 = deRandom_getFloat((deRandom *)&local_1f8);
      fVar14 = fVar14 * 3.8 + 0.2;
      uVar3 = *(undefined8 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
      *(ulong *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11) =
           CONCAT44(fVar14 * (float)((ulong)uVar3 >> 0x20),fVar14 * (float)uVar3);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 8) =
           *(float *)((long)(drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 8) *
           fVar14;
    }
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 0xc) = fVar14;
    uVar3 = *(undefined8 *)((long)(local_1b8 + lVar11 + (uVar13 / 3) * -0x30) + 8);
    puVar1 = (undefined8 *)
             ((long)(colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
    *puVar1 = *(undefined8 *)(local_1b8 + lVar11 + (uVar13 / 3) * -0x30);
    puVar1[1] = uVar3;
    uVar13 = uVar13 + 1;
    lVar11 = lVar11 + 0x10;
  }
  iVar5 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  if (iVar5 == 4) {
    for (iVar5 = 2; iVar10 = iVar5 + -2,
        iVar10 < (int)((ulong)((long)drawBuffer.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2;
        iVar5 = iVar5 + 3) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_1b8);
      local_1b8 = *(undefined1 (*) [8])
                   drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data;
      pSStack_1b0 = *(pointer *)
                     (drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data + 2);
      local_1a8._M_allocated_capacity =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar5 + -1].m_data;
      local_1a8._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar5 + -1].m_data + 2);
      local_198._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar5].m_data;
      local_198._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar5].m_data + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      if ((this->super_BaseRenderingCase).m_flatshade == true) {
        local_198._16_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar5].m_data;
        afStack_180 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data + 2);
        local_178 = *(float (*) [2])
                     colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data;
        afStack_170 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data + 2);
      }
      else {
        local_198._16_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar10].m_data;
        afStack_180 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data + 2);
        local_178 = *(float (*) [2])
                     colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar5 + -1].m_data;
        afStack_170 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar5 + -1].m_data + 2);
      }
      local_168 = *(float (*) [2])
                   colorBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data;
      afStack_160 = *(float (*) [2])
                     (colorBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_268,(SceneTriangle *)local_1b8);
    }
  }
  else if (iVar5 == 5) {
    lVar12 = 0x200000000;
    lVar11 = 0x10;
    for (lVar8 = 0;
        lVar8 < ((long)drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x200000000 >> 0x20
        ; lVar8 = lVar8 + 1) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_1b8);
      puVar1 = (undefined8 *)
               ((long)drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar11);
      local_1b8 = (undefined1  [8])*puVar1;
      pSStack_1b0 = (pointer)puVar1[1];
      psVar2 = (size_type *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
      local_1a8._M_allocated_capacity = *psVar2;
      local_1a8._8_8_ = psVar2[1];
      lVar6 = lVar12 >> 0x20;
      pfVar7 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        (lVar12 >> 0x1c));
      local_198._0_8_ = *(undefined8 *)pfVar7;
      local_198._8_8_ = *(undefined8 *)(pfVar7 + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      if ((this->super_BaseRenderingCase).m_flatshade == true) {
        local_198._16_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar6].m_data;
        afStack_180 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].m_data + 2);
        local_178 = *(float (*) [2])
                     colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar6].m_data;
        afStack_170 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].m_data + 2);
      }
      else {
        pfVar7 = (float *)((long)colorBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar11);
        local_198._16_8_ = *(undefined8 *)pfVar7;
        afStack_180 = *(float (*) [2])(pfVar7 + 2);
        pfVar7 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
        local_178 = *(float (*) [2])pfVar7;
        afStack_170 = *(float (*) [2])(pfVar7 + 2);
      }
      local_168 = *(float (*) [2])
                   colorBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar6].m_data;
      afStack_160 = *(float (*) [2])
                     (colorBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar6].m_data + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_268,(SceneTriangle *)local_1b8);
      lVar12 = lVar12 + 0x100000000;
      lVar11 = lVar11 + 0x10;
    }
  }
  else if (iVar5 == 6) {
    lVar11 = 1;
    lVar12 = 0x20;
    while (lVar11 < ((long)drawBuffer.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                    0x20) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_1b8);
      local_1b8 = *(undefined1 (*) [8])
                   (drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data;
      pSStack_1b0 = *(pointer *)
                     ((drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + 2);
      psVar2 = (size_type *)
               ((long)drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar12);
      local_1a8._M_allocated_capacity = *psVar2;
      local_1a8._8_8_ = psVar2[1];
      lVar11 = lVar11 + 1;
      pfVar7 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      local_198._0_8_ = *(undefined8 *)pfVar7;
      local_198._8_8_ = *(undefined8 *)(pfVar7 + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      if ((this->super_BaseRenderingCase).m_flatshade == true) {
        pfVar7 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_198._16_8_ = *(undefined8 *)pfVar7;
        afStack_180 = *(float (*) [2])(pfVar7 + 2);
        pfVar7 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_178 = *(float (*) [2])pfVar7;
        afStack_170 = *(float (*) [2])(pfVar7 + 2);
        lVar8 = lVar12;
      }
      else {
        local_198._16_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data;
        afStack_180 = *(float (*) [2])
                       ((colorBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + 2);
        pfVar7 = (float *)((long)colorBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar12);
        local_178 = *(float (*) [2])pfVar7;
        afStack_170 = *(float (*) [2])(pfVar7 + 2);
        lVar8 = lVar11 * 0x10;
      }
      pfVar7 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8);
      local_168 = *(float (*) [2])pfVar7;
      afStack_160 = *(float (*) [2])(pfVar7 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_268,(SceneTriangle *)local_1b8);
      lVar12 = lVar12 + 0x10;
    }
  }
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::operator<<((ostream *)&pSStack_1b0,"Generated vertices:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  lVar11 = 0;
  for (lVar12 = 0;
      lVar12 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar12 = lVar12 + 1) {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
    std::operator<<((ostream *)&pSStack_1b0,"\t");
    tcu::operator<<((ostream *)&pSStack_1b0,
                    (Vector<float,_4> *)
                    ((long)(drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11));
    std::operator<<((ostream *)&pSStack_1b0,",\tcolor= ");
    tcu::operator<<((ostream *)&pSStack_1b0,
                    (Vector<float,_4> *)
                    ((long)(colorBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
    lVar11 = lVar11 + 0x10;
  }
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,&colorBuffer,
             *(GLenum *)&(this->super_BaseRenderingCase).field_0xc4);
  local_1f8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1f8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  local_1f8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_1f8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_1f8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_1b8 = (undefined1  [8])local_268._M_impl.super__Vector_impl_data._M_start;
  pSStack_1b0 = local_268._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._M_allocated_capacity =
       (size_type)local_268._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = tcu::verifyTriangleGroupInterpolation
                    (&resultImage,(TriangleSceneSpec *)local_1b8,&local_1f8,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  if (!bVar4) {
    this->m_allIterationsPassed = false;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)local_1b8);
  iVar5 = this->m_iteration + 1;
  this->m_iteration = iVar5;
  if (iVar5 == this->m_iterationCount) {
    description = "Found invalid pixel values";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar9 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  else {
    IVar9 = CONTINUE;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base(&local_268);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar9;
}

Assistant:

TriangleInterpolationTest::IterateResult TriangleInterpolationTest::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_testCtx.getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");

		return STOP;
	}
	else
		return CONTINUE;
}